

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

double __thiscall Mat::sqrt(Mat *this,double __x)

{
  int iVar1;
  int iVar2;
  undefined8 extraout_RAX;
  reference pvVar3;
  undefined8 extraout_RDX;
  int *in_RSI;
  double extraout_XMM0_Qa;
  double dVar4;
  double __x_00;
  double extraout_XMM0_Qa_00;
  int i;
  int l;
  Mat *ret;
  undefined8 in_stack_ffffffffffffff88;
  int local_1c;
  
  Mat(this,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88);
  iVar1 = *in_RSI;
  iVar2 = in_RSI[1];
  dVar4 = extraout_XMM0_Qa;
  for (local_1c = 0; local_1c < iVar1 * iVar2; local_1c = local_1c + 1) {
    std::vector<__int128,_std::allocator<__int128>_>::operator[]
              ((vector<__int128,_std::allocator<__int128>_> *)(in_RSI + 4),(long)local_1c);
    Constant::Util::sqrt(__x_00);
    pvVar3 = std::vector<__int128,_std::allocator<__int128>_>::operator[](&this->val,(long)local_1c)
    ;
    *(undefined8 *)((long)pvVar3 + 8) = extraout_RDX;
    *(undefined8 *)pvVar3 = extraout_RAX;
    dVar4 = extraout_XMM0_Qa_00;
  }
  return dVar4;
}

Assistant:

Mat Mat::sqrt() {
    Mat ret(r, c);
    int l = r * c;
    for (int i = 0; i < l; i++) {
        ret.val[i] = Constant::Util::sqrt(val[i]);
    }
    return ret;
}